

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O0

void __thiscall Gluco::Solver::toDimacs(Solver *this,FILE *f,vec<Gluco::Lit> *assumps)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Var VVar6;
  uint *puVar7;
  Clause *pCVar8;
  Lit *pLVar9;
  char *pcVar10;
  uchar *tbs;
  size_t *siglen;
  uchar *sig;
  size_t in_R8;
  lbool local_75;
  int local_74;
  lbool local_6d;
  int local_6c;
  lbool local_65;
  int local_64;
  lbool local_5d;
  int local_5c;
  Clause *pCStack_58;
  int j;
  Clause *c;
  uint local_3c;
  uint local_38;
  int cnt;
  int i;
  Var max;
  vec<int> map;
  vec<Gluco::Lit> *assumps_local;
  FILE *f_local;
  Solver *this_local;
  
  map._8_8_ = assumps;
  if ((this->ok & 1U) == 0) {
    fprintf((FILE *)f,"p cnf 1 2\n1 0\n-1 0\n");
  }
  else {
    vec<int>::vec((vec<int> *)&i);
    cnt = 0;
    local_3c = 0;
    for (local_38 = 0; uVar5 = local_38, iVar2 = vec<unsigned_int>::size(&this->clauses),
        (int)uVar5 < iVar2; local_38 = local_38 + 1) {
      puVar7 = vec<unsigned_int>::operator[](&this->clauses,local_38);
      pCVar8 = ClauseAllocator::operator[](&this->ca,*puVar7);
      bVar1 = satisfied(this,pCVar8);
      if (!bVar1) {
        local_3c = local_3c + 1;
      }
    }
    for (local_38 = 0; uVar5 = local_38, iVar2 = vec<unsigned_int>::size(&this->clauses),
        (int)uVar5 < iVar2; local_38 = local_38 + 1) {
      puVar7 = vec<unsigned_int>::operator[](&this->clauses,local_38);
      pCVar8 = ClauseAllocator::operator[](&this->ca,*puVar7);
      bVar1 = satisfied(this,pCVar8);
      if (!bVar1) {
        puVar7 = vec<unsigned_int>::operator[](&this->clauses,local_38);
        pCStack_58 = ClauseAllocator::operator[](&this->ca,*puVar7);
        for (local_5c = 0; iVar2 = local_5c, iVar3 = Clause::size(pCStack_58), iVar2 < iVar3;
            local_5c = local_5c + 1) {
          pLVar9 = Clause::operator[](pCStack_58,local_5c);
          local_64 = pLVar9->x;
          local_5d = value(this,(Lit)local_64);
          lbool::lbool(&local_65,'\x01');
          bVar1 = lbool::operator!=(&local_5d,local_65);
          if (bVar1) {
            pLVar9 = Clause::operator[](pCStack_58,local_5c);
            local_6c = pLVar9->x;
            iVar2 = Gluco::var((Lit)local_6c);
            mapVar(iVar2,(vec<int> *)&i,&cnt);
          }
        }
      }
    }
    iVar2 = vec<Gluco::Lit>::size(&this->assumptions);
    local_3c = iVar2 + local_3c;
    fprintf((FILE *)f,"p cnf %d %d\n",(ulong)(uint)cnt,(ulong)local_3c);
    local_38 = 0;
    while( true ) {
      uVar5 = local_38;
      uVar4 = vec<Gluco::Lit>::size(&this->assumptions);
      tbs = (uchar *)(ulong)uVar4;
      if ((int)uVar4 <= (int)uVar5) break;
      pLVar9 = vec<Gluco::Lit>::operator[](&this->assumptions,local_38);
      local_74 = pLVar9->x;
      local_6d = value(this,(Lit)local_74);
      lbool::lbool(&local_75,'\x01');
      bVar1 = lbool::operator!=(&local_6d,local_75);
      if (!bVar1) {
        __assert_fail("value(assumptions[i]) != l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Glucose.cpp"
                      ,0x55b,"void Gluco::Solver::toDimacs(FILE *, const vec<Lit> &)");
      }
      sig = (uchar *)(ulong)local_38;
      pLVar9 = vec<Gluco::Lit>::operator[](&this->assumptions,local_38);
      uVar5 = Gluco::sign((EVP_PKEY_CTX *)(ulong)(uint)pLVar9->x,sig,siglen,tbs,in_R8);
      pcVar10 = "";
      if ((uVar5 & 1) != 0) {
        pcVar10 = "-";
      }
      pLVar9 = vec<Gluco::Lit>::operator[](&this->assumptions,local_38);
      iVar2 = Gluco::var((Lit)pLVar9->x);
      VVar6 = mapVar(iVar2,(vec<int> *)&i,&cnt);
      fprintf((FILE *)f,"%s%d 0\n",pcVar10,(ulong)(VVar6 + 1));
      local_38 = local_38 + 1;
    }
    for (local_38 = 0; uVar5 = local_38, iVar2 = vec<unsigned_int>::size(&this->clauses),
        (int)uVar5 < iVar2; local_38 = local_38 + 1) {
      puVar7 = vec<unsigned_int>::operator[](&this->clauses,local_38);
      pCVar8 = ClauseAllocator::operator[](&this->ca,*puVar7);
      toDimacs(this,f,pCVar8,(vec<int> *)&i,&cnt);
    }
    if (0 < this->verbosity) {
      printf("Wrote %d clauses with %d variables.\n",(ulong)local_3c,(ulong)(uint)cnt);
    }
    vec<int>::~vec((vec<int> *)&i);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int i, cnt = 0;
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumptions.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (i = 0; i < assumptions.size(); i++){
        assert(value(assumptions[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumptions[i]) ? "-" : "", mapVar(var(assumptions[i]), map, max)+1);
    }

    for (i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote %d clauses with %d variables.\n", cnt, max);
}